

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O1

OPTIONHANDLER_HANDLE socketio_retrieveoptions(CONCRETE_IO_HANDLE handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle_00;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (handle == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "failed retrieving options (handle is NULL)";
      iVar3 = 0xb0;
LAB_00189da5:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                ,"socketio_retrieveoptions",iVar3,1,pcVar4);
      return (OPTIONHANDLER_HANDLE)0x0;
    }
  }
  else {
    handle_00 = OptionHandler_Create(socketio_CloneOption,socketio_DestroyOption,socketio_setoption)
    ;
    if (handle_00 == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "unable to OptionHandler_Create";
        iVar3 = 0xba;
        goto LAB_00189da5;
      }
    }
    else {
      if (*(void **)((long)handle + 0x48) == (void *)0x0) {
        return handle_00;
      }
      OVar1 = OptionHandler_AddOption
                        (handle_00,"net_interface_mac_address",*(void **)((long)handle + 0x48));
      if (OVar1 == OPTIONHANDLER_OK) {
        return handle_00;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                  ,"socketio_retrieveoptions",0xbf,1,
                  "failed retrieving options (failed adding net_interface_mac_address)");
      }
      OptionHandler_Destroy(handle_00);
    }
  }
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

static OPTIONHANDLER_HANDLE socketio_retrieveoptions(CONCRETE_IO_HANDLE handle)
{
    OPTIONHANDLER_HANDLE result;

    if (handle == NULL)
    {
        LogError("failed retrieving options (handle is NULL)");
        result = NULL;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)handle;

        result = OptionHandler_Create(socketio_CloneOption, socketio_DestroyOption, socketio_setoption);
        if (result == NULL)
        {
            LogError("unable to OptionHandler_Create");
        }
        else if (socket_io_instance->target_mac_address != NULL &&
            OptionHandler_AddOption(result, OPTION_NET_INT_MAC_ADDRESS, socket_io_instance->target_mac_address) != OPTIONHANDLER_OK)
        {
            LogError("failed retrieving options (failed adding net_interface_mac_address)");
            OptionHandler_Destroy(result);
            result = NULL;
        }
    }

    return result;
}